

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O0

int viewCallback(void *NotUsed,int argc,char **argv,char **azColName)

{
  int local_6c;
  char local_68 [4];
  int i;
  char tmp_str [64];
  char **azColName_local;
  char **argv_local;
  int argc_local;
  void *NotUsed_local;
  
  tmp_str._56_8_ = azColName;
  memset(local_68,0,0x40);
  for (local_6c = 0; local_6c < argc; local_6c = local_6c + 1) {
    if (local_6c == 0) {
      snprintf(local_68,0x40,"%s   ",*argv);
    }
    else if (local_6c == 1) {
      snprintf(local_68,0x40,"%s     ",argv[1]);
    }
    else if (local_6c == 2) {
      snprintf(local_68,0x40,"%s",argv[2]);
    }
    strcat(query_result_g,local_68);
  }
  strcat(query_result_g,"\n");
  return 0;
}

Assistant:

int 
viewCallback (void* NotUsed, int argc, char** argv, char** azColName) 
{
    /*  Format of returned string:
     *  18/06/2020, room 21, reserve code: 8GT4A
     */


    // query_result_g is the payload "to be returned". 
    // query_result_g is a global variable!

    // clean payload right before filling if from scratch.
    // memset(query_result_g, '\0', sizeof(query_result_g));

    
    char tmp_str[64];
    memset(tmp_str, '\0', sizeof(tmp_str));


    for (int i = 0; i < argc; i++)
    {
        if (i==0){
            snprintf(tmp_str, sizeof(tmp_str), "%s   ", argv[i]);
        }
        else if (i == 1){
            snprintf(tmp_str, sizeof(tmp_str), "%s     ", argv[i]);   
        }
        else if (i == 2){
            snprintf(tmp_str, sizeof(tmp_str), "%s", argv[i]);   
        }
        strcat(query_result_g, tmp_str);

    }
    
    strcat(query_result_g, "\n");
        

    return 0;
}